

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::SVInt>::emplace_back<slang::SVInt&>
          (SmallVectorBase<slang::SVInt> *this,SVInt *args)

{
  pointer pSVar1;
  reference pSVar2;
  
  if (this->len == this->cap) {
    pSVar1 = emplaceRealloc<slang::SVInt&>(this,this->data_ + this->len,args);
    return pSVar1;
  }
  SVInt::SVInt(this->data_ + this->len,&args->super_SVIntStorage);
  this->len = this->len + 1;
  pSVar2 = back(this);
  return pSVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }